

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  uint uVar1;
  istream *piVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  double value;
  string buffer;
  istringstream is;
  long *local_258 [2];
  long local_248 [2];
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  string local_218;
  long *local_1f8 [2];
  long local_1e8 [2];
  Value local_1d8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,token->start_,token->end_);
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_1f8,_S_in);
  piVar2 = std::istream::_M_extract<double>((double *)local_1b0);
  uVar1 = *(uint *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    Value::Value(&local_1d8,0.0);
    Value::operator=(decoded,&local_1d8);
    Value::~Value(&local_1d8);
  }
  else {
    local_258[0] = local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,token->start_,token->end_);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_258,0,(char *)0x0,0x52c1ae);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_228 = *plVar4;
      lStack_220 = plVar3[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *plVar4;
      local_238 = (long *)*plVar3;
    }
    local_230 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_238);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_218.field_2._M_allocated_capacity = *psVar5;
      local_218.field_2._8_8_ = plVar3[3];
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    }
    else {
      local_218.field_2._M_allocated_capacity = *psVar5;
      local_218._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_218._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    addError(this,&local_218,token,(Location)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_258[0] != local_248) {
      operator_delete(local_258[0],local_248[0] + 1);
    }
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  JSONCPP_STRING buffer(token.start_, token.end_);
  JSONCPP_ISTRINGSTREAM is(buffer);
  if (!(is >> value))
    return addError("'" + JSONCPP_STRING(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}